

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3TermSelect(Fts3Table *p,Fts3PhraseToken *pTok,int iColumn,int *pnOut,char **ppOut)

{
  Fts3MultiSegReader *pCsr;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int local_11c;
  undefined1 auStack_118 [4];
  int i;
  Fts3SegFilter filter;
  TermSelect tsc;
  Fts3MultiSegReader *pSegcsr;
  int rc;
  char **ppOut_local;
  int *pnOut_local;
  int iColumn_local;
  Fts3PhraseToken *pTok_local;
  Fts3Table *p_local;
  
  pCsr = pTok->pSegcsr;
  memset(&filter.flags,0,0xc0);
  uVar1 = 0;
  if (pTok->isPrefix != 0) {
    uVar1 = 8;
  }
  uVar2 = 0;
  if (pTok->bFirst != 0) {
    uVar2 = 0x20;
  }
  uVar3 = 0;
  if (iColumn < p->nColumn) {
    uVar3 = 4;
  }
  filter.nTerm = uVar1 | 3 | uVar2 | uVar3;
  _auStack_118 = pTok->z;
  filter.zTerm._0_4_ = pTok->n;
  filter.zTerm._4_4_ = iColumn;
  pSegcsr._4_4_ = sqlite3Fts3SegReaderStart(p,pCsr,(Fts3SegFilter *)auStack_118);
  while( true ) {
    bVar4 = false;
    if (pSegcsr._4_4_ == 0) {
      pSegcsr._4_4_ = sqlite3Fts3SegReaderStep(p,pCsr);
      bVar4 = pSegcsr._4_4_ == 100;
    }
    if (!bVar4) break;
    pSegcsr._4_4_ = fts3TermSelectMerge(p,(TermSelect *)&filter.flags,pCsr->aDoclist,pCsr->nDoclist)
    ;
  }
  if (pSegcsr._4_4_ == 0) {
    pSegcsr._4_4_ = fts3TermSelectFinishMerge(p,(TermSelect *)&filter.flags);
  }
  if (pSegcsr._4_4_ == 0) {
    *ppOut = (char *)filter._16_8_;
    *pnOut = (int)tsc.aaOutput[0xf];
  }
  else {
    for (local_11c = 0; local_11c < 0x10; local_11c = local_11c + 1) {
      sqlite3_free(tsc.aaOutput[(long)local_11c + -1]);
    }
  }
  fts3SegReaderCursorFree(pCsr);
  pTok->pSegcsr = (Fts3MultiSegReader *)0x0;
  return pSegcsr._4_4_;
}

Assistant:

static int fts3TermSelect(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3PhraseToken *pTok,          /* Token to query for */
  int iColumn,                    /* Column to query (or -ve for all columns) */
  int *pnOut,                     /* OUT: Size of buffer at *ppOut */
  char **ppOut                    /* OUT: Malloced result buffer */
){
  int rc;                         /* Return code */
  Fts3MultiSegReader *pSegcsr;    /* Seg-reader cursor for this term */
  TermSelect tsc;                 /* Object for pair-wise doclist merging */
  Fts3SegFilter filter;           /* Segment term filter configuration */

  pSegcsr = pTok->pSegcsr;
  memset(&tsc, 0, sizeof(TermSelect));

  filter.flags = FTS3_SEGMENT_IGNORE_EMPTY | FTS3_SEGMENT_REQUIRE_POS
        | (pTok->isPrefix ? FTS3_SEGMENT_PREFIX : 0)
        | (pTok->bFirst ? FTS3_SEGMENT_FIRST : 0)
        | (iColumn<p->nColumn ? FTS3_SEGMENT_COLUMN_FILTER : 0);
  filter.iCol = iColumn;
  filter.zTerm = pTok->z;
  filter.nTerm = pTok->n;

  rc = sqlite3Fts3SegReaderStart(p, pSegcsr, &filter);
  while( SQLITE_OK==rc
      && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pSegcsr)) 
  ){
    rc = fts3TermSelectMerge(p, &tsc, pSegcsr->aDoclist, pSegcsr->nDoclist);
  }

  if( rc==SQLITE_OK ){
    rc = fts3TermSelectFinishMerge(p, &tsc);
  }
  if( rc==SQLITE_OK ){
    *ppOut = tsc.aaOutput[0];
    *pnOut = tsc.anOutput[0];
  }else{
    int i;
    for(i=0; i<SizeofArray(tsc.aaOutput); i++){
      sqlite3_free(tsc.aaOutput[i]);
    }
  }

  fts3SegReaderCursorFree(pSegcsr);
  pTok->pSegcsr = 0;
  return rc;
}